

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmMakefile *this_00;
  string_view str;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  TargetType TVar5;
  string *config_00;
  ulong uVar6;
  bool local_3a7;
  bool local_3a6;
  bool local_344;
  allocator<char> local_341;
  string local_340;
  string_view local_320;
  size_t local_310;
  char *local_308;
  string_view local_300;
  undefined1 local_2f0 [8];
  LinkEntry libEntry;
  cmListFileBacktrace local_278;
  string local_268;
  undefined1 local_248 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lib;
  undefined1 local_210 [4];
  ArtifactType artifact_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1e0;
  LinkEntry local_1b0;
  string local_150;
  string *local_130;
  string *libName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  byte local_fa;
  allocator<char> local_f9;
  string local_f8;
  FeatureDescriptor *local_d8;
  ItemIsPath local_cc;
  cmListFileBacktrace local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_88;
  undefined1 local_58 [8];
  string exe;
  ArtifactType artifact;
  bool impexe;
  string *config;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  cmGeneratorTarget *tgt;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  item = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         entry->Target;
  config_00 = &this->Config;
  local_344 = false;
  tgt = (cmGeneratorTarget *)entry;
  entry_local = (LinkEntry *)this;
  if ((cmGeneratorTarget *)item != (cmGeneratorTarget *)0x0) {
    local_344 = cmGeneratorTarget::IsExecutableWithExports((cmGeneratorTarget *)item);
  }
  exe.field_2._M_local_buf[0xf] = local_344;
  if (((local_344 != false) &&
      (bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)item,config_00), !bVar2)) &&
     (bVar2 = cmValue::operator_cast_to_bool(&this->LoaderFlag), !bVar2)) {
    return;
  }
  if ((item == (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) || (bVar2 = cmGeneratorTarget::IsLinkable((cmGeneratorTarget *)item), !bVar2)
     ) {
    local_300 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&tgt->CompileInfoMap);
    local_320 = (string_view)::cm::operator____s("FRAMEWORK",9);
    local_310 = local_320._M_len;
    local_308 = local_320._M_str;
    bVar3 = cmHasSuffix(local_300,local_320);
    bVar1 = false;
    bVar2 = false;
    local_3a6 = true;
    if (!bVar3) {
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tgt->CompileInfoMap,
                              &cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
      local_3a7 = false;
      if (_Var4) {
        bVar3 = cmSystemTools::IsPathToFramework((string *)entry);
        local_3a7 = false;
        if (bVar3) {
          this_00 = this->Makefile;
          std::allocator<char>::allocator();
          bVar1 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_340,"APPLE",&local_341);
          bVar2 = true;
          local_3a7 = cmMakefile::IsOn(this_00,&local_340);
        }
      }
      local_3a6 = local_3a7;
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_340);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_341);
    }
    if (local_3a6 != false) {
      AddFrameworkItem(this,(LinkEntry *)tgt);
      return;
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar2) {
      AddUserItem(this,(LinkEntry *)tgt,true);
      return;
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory((string *)entry);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Depends,(value_type *)entry);
      AddFullItem(this,(LinkEntry *)tgt);
      AddLibraryRuntimeInfo(this,(string *)entry);
      return;
    }
    DropDirectoryItem(this,&entry->Item);
    return;
  }
  if (((exe.field_2._M_local_buf[0xf] & 1U) != 0) &&
     (bVar2 = cmValue::operator_cast_to_bool(&this->LoaderFlag), bVar2)) {
    bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)item,config_00);
    exe.field_2._8_4_ = ZEXT14(bVar2);
    cmGeneratorTarget::GetFullPath
              ((string *)local_58,(cmGeneratorTarget *)item,config_00,exe.field_2._8_4_,true);
    std::__cxx11::string::string((string *)&local_a8,(string *)local_58);
    cmListFileBacktrace::cmListFileBacktrace(local_c8,&(entry->Item).Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_88,&local_a8,local_c8);
    local_cc = Yes;
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tgt->CompileInfoMap,
                            &cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
    local_fa = 0;
    if (_Var4) {
      std::allocator<char>::allocator();
      local_fa = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"__CMAKE_LINK_EXECUTABLE",&local_f9);
    }
    else {
      std::__cxx11::string::string((string *)&local_f8,(string *)&tgt->CompileInfoMap);
    }
    local_d8 = FindLibraryFeature(this,&local_f8);
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_88,&local_cc,(cmGeneratorTarget **)&item,&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    if ((local_fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_f9);
    }
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_88);
    cmListFileBacktrace::~cmListFileBacktrace(local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,(value_type *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    return;
  }
  TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item);
  if (TVar5 == INTERFACE_LIBRARY) {
    std::__cxx11::string::string((string *)&local_120);
    libName._4_4_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_120,(ItemIsPath *)((long)&libName + 4),(cmGeneratorTarget **)&item);
    std::__cxx11::string::~string((string *)&local_120);
    cmGeneratorTarget::GetImportedLibName(&local_150,(cmGeneratorTarget *)item,config_00);
    local_130 = &local_150;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_200,(string *)local_130);
      cmListFileBacktrace::cmListFileBacktrace
                ((cmListFileBacktrace *)local_210,&(entry->Item).Backtrace);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_1e0,&local_200,(cmListFileBacktrace *)local_210);
      cmComputeLinkDepends::LinkEntry::LinkEntry(&local_1b0,&local_1e0,(cmGeneratorTarget *)0x0);
      AddItem(this,&local_1b0);
      cmComputeLinkDepends::LinkEntry::~LinkEntry(&local_1b0);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_1e0);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_210);
      std::__cxx11::string::~string((string *)&local_200);
    }
    std::__cxx11::string::~string((string *)&local_150);
    return;
  }
  TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item);
  if (TVar5 == OBJECT_LIBRARY) {
    return;
  }
  bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)item,config_00);
  lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = (ArtifactType)bVar2;
  cmGeneratorTarget::GetFullPath
            (&local_268,(cmGeneratorTarget *)item,config_00,
             lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._4_4_,true);
  cmListFileBacktrace::cmListFileBacktrace(&local_278,&(entry->Item).Backtrace);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_248,&local_268,&local_278);
  cmListFileBacktrace::~cmListFileBacktrace(&local_278);
  std::__cxx11::string::~string((string *)&local_268);
  bVar2 = cmTarget::IsAIX(*(cmTarget **)&item->Value);
  if (bVar2) {
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_248)
    ;
    bVar2 = cmHasLiteralSuffix<10ul>(str,(char (*) [10])0xd29ae6);
    if ((bVar2) &&
       (lib.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ == ImportLibraryArtifact)) {
      libEntry.Feature.field_2._12_4_ = 1;
      goto LAB_00744dd4;
    }
  }
  if (((this->LinkDependsNoShared & 1U) == 0) ||
     (TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item), TVar5 != SHARED_LIBRARY)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,(value_type *)local_248);
  }
  cmComputeLinkDepends::LinkEntry::LinkEntry((LinkEntry *)local_2f0,(LinkEntry *)tgt);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_2f0,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_248);
  AddTargetItem(this,(LinkEntry *)local_2f0);
  AddLibraryRuntimeInfo(this,(string *)local_248,(cmGeneratorTarget *)item);
  if (((item != (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) &&
      (TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)item), TVar5 == SHARED_LIBRARY)) &&
     (bVar2 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar2)) {
    AddRuntimeDLL(this,(cmGeneratorTarget *)item);
  }
  cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)local_2f0);
  libEntry.Feature.field_2._12_4_ = 0;
LAB_00744dd4:
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_248);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // Ignore object library!
      // Its object-files should already have been extracted for linking.
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->Target->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      this->AddLibraryRuntimeInfo(lib.Value, tgt);
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Makefile->IsOn("APPLE"))) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}